

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.cc
# Opt level: O0

uint64_t bloaty::TryReadPcPair(CU *cu,GeneralDIE *die,RangeSink *sink)

{
  bool bVar1;
  unsigned_long *puVar2;
  RangeSink *analyzer;
  uint64_t in_RDX;
  CU *in_RDI;
  uint64_t size;
  uint64_t addr;
  unsigned_long vmaddr;
  RangeSink *this;
  unsigned_long local_8;
  
  bVar1 = std::optional::operator_cast_to_bool((optional<unsigned_long> *)0x20c151);
  if (bVar1) {
    puVar2 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)0x20c171);
    local_8 = *puVar2;
    bVar1 = std::optional::operator_cast_to_bool((optional<unsigned_long> *)0x20c187);
    if (bVar1) {
      puVar2 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)0x20c19b);
      analyzer = (RangeSink *)(*puVar2 - local_8);
    }
    else {
      bVar1 = std::optional::operator_cast_to_bool((optional<unsigned_long> *)0x20c1b8);
      if (!bVar1) {
        return 0;
      }
      puVar2 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)0x20c1cc);
      analyzer = (RangeSink *)*puVar2;
    }
    vmaddr = local_8;
    this = analyzer;
    dwarf::CU::unit_name_abi_cxx11_(in_RDI);
    RangeSink::AddVMRangeIgnoreDuplicate(this,(char *)analyzer,vmaddr,in_RDX,(string *)0x20c227);
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

uint64_t TryReadPcPair(const dwarf::CU& cu, const GeneralDIE& die,
                       RangeSink* sink) {
  uint64_t addr;
  uint64_t size;

  if (!die.low_pc) return 0;
  addr = *die.low_pc;

  if (die.high_pc_addr) {
    size = *die.high_pc_addr - addr;
  } else if (die.high_pc_size) {
    size = *die.high_pc_size;
  } else{
    return 0;
  }

  sink->AddVMRangeIgnoreDuplicate("dwarf_pcpair", addr, size, cu.unit_name());
  return addr;
}